

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

int32 __thiscall
Js::JavascriptArray::GetNativeValue<int>
          (JavascriptArray *this,Var ival,ScriptContext *scriptContext)

{
  int32 iVar1;
  
  iVar1 = JavascriptConversion::ToInt32(ival,scriptContext);
  return iVar1;
}

Assistant:

int32 JavascriptArray::GetNativeValue<int32>(Js::Var ival, ScriptContext * scriptContext)
    {
        return JavascriptConversion::ToInt32(ival, scriptContext);
    }